

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void set_mimic_blocking(void)

{
  monst *local_10;
  monst *mon;
  
  for (local_10 = level->monlist; local_10 != (monst *)0x0; local_10 = local_10->nmon) {
    if (((0 < local_10->mhp) && ((*(uint *)&local_10->field_0x60 >> 1 & 1) != 0)) &&
       (((local_10->m_ap_type == '\x01' &&
         ((local_10->mappearance == 0x1b || (local_10->mappearance == 0x1c)))) ||
        ((local_10->m_ap_type == '\x02' && (local_10->mappearance == 0x214)))))) {
      if (((u.uprops[0xc].intrinsic == 0) && (u.uprops[0xc].extrinsic == 0)) &&
         (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
        unblock_point((int)local_10->mx,(int)local_10->my);
      }
      else {
        block_point((int)local_10->mx,(int)local_10->my);
      }
    }
  }
  return;
}

Assistant:

void set_mimic_blocking(void)
{
    struct monst *mon;

    for (mon = level->monlist; mon; mon = mon->nmon) {
	if (DEADMONSTER(mon)) continue;
	if (mon->minvis &&
	   ((mon->m_ap_type == M_AP_FURNITURE &&
	     (mon->mappearance == S_vcdoor || mon->mappearance == S_hcdoor)) ||
	    (mon->m_ap_type == M_AP_OBJECT && mon->mappearance == BOULDER))) {
	    if (See_invisible)
		block_point(mon->mx, mon->my);
	    else
		unblock_point(mon->mx, mon->my);
	}
    }
}